

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

bool __thiscall
cli::Parser::
CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::parse
          (CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,ostream *param_1,ostream *param_2)

{
  string local_48;
  ostream *local_28;
  ostream *param_2_local;
  ostream *param_1_local;
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_28 = param_2;
  param_2_local = param_1;
  param_1_local = (ostream *)this;
  Parser::parse(&local_48,&(this->super_CmdBase).arguments,&this->value);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->value,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return true;
}

Assistant:

virtual bool parse(std::ostream&, std::ostream&) {
				try {
					value = Parser::parse(arguments, value);
					return true;
				} catch (...) {
					return false;
				}
			}